

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<ninx::parser::element::ForStatement,_std::default_delete<ninx::parser::element::ForStatement>_>
 __thiscall ninx::parser::Parser::parse_for_statement(Parser *this)

{
  TokenReader *this_00;
  pointer pcVar1;
  int iVar2;
  Token *pTVar3;
  Variable *this_01;
  string *psVar4;
  ForStatement *this_02;
  undefined8 extraout_RAX;
  pointer *__ptr;
  Parser *in_RSI;
  string iterator_name;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> local_78;
  string local_70;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  this_00 = &in_RSI->reader;
  iVar2 = TokenReader::check_type(this_00,FOR);
  if (iVar2 == 1) {
    TokenReader::get_token(this_00);
    iVar2 = TokenReader::check_type(this_00,VARIABLE);
    if (iVar2 == 1) {
      pTVar3 = TokenReader::get_token(this_00);
      this_01 = (Variable *)
                __dynamic_cast(pTVar3,&lexer::token::Token::typeinfo,
                               &lexer::token::Variable::typeinfo,0);
      psVar4 = lexer::token::Variable::get_name_abi_cxx11_(this_01);
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + psVar4->_M_string_length);
      iVar2 = TokenReader::check_limiter(this_00,':');
      if (iVar2 == 1) {
        TokenReader::get_token(this_00);
        parse_level_3_expression((Parser *)local_50);
        parse_block((Parser *)(local_50 + 8));
        this_02 = (ForStatement *)operator_new(0x48);
        local_40._M_allocated_capacity = local_50._0_8_;
        local_50._0_8_ = (pointer)0x0;
        local_78._M_head_impl = (Block *)local_50._8_8_;
        element::ForStatement::ForStatement
                  (this_02,&local_70,
                   (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                    *)&local_40._M_allocated_capacity,
                   (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                    *)&local_78);
        (this->origin)._M_dataplus._M_p = (pointer)this_02;
        if (local_78._M_head_impl != (Block *)0x0) {
          (*((local_78._M_head_impl)->super_Expression).super_Statement.super_ASTElement.
            _vptr_ASTElement[1])();
        }
        local_78._M_head_impl = (Block *)0x0;
        if ((long *)local_40._M_allocated_capacity != (long *)0x0) {
          (**(code **)(*(long *)local_40._M_allocated_capacity + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        return (__uniq_ptr_data<ninx::parser::element::ForStatement,_std::default_delete<ninx::parser::element::ForStatement>,_true,_true>
                )(__uniq_ptr_data<ninx::parser::element::ForStatement,_std::default_delete<ninx::parser::element::ForStatement>,_true,_true>
                  )this;
      }
      goto LAB_00123ae2;
    }
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Expected for statement","")
    ;
    generate_exception(in_RSI,&local_70);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Expected iterator name ( as variable, for example $i )","");
  generate_exception(in_RSI,&local_70);
LAB_00123ae2:
  local_30._0_8_ =
       (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
        *)0x6465746365707845;
  local_30._8_2_ = 0x3a20;
  local_40._8_8_ = 10;
  local_30._M_local_buf[10] = '\0';
  local_40._M_allocated_capacity = (size_type)&local_30;
  generate_exception(in_RSI,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_30) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::unique_ptr<ForStatement> ninx::parser::Parser::parse_for_statement() {
    if (reader.check_type(Type::FOR) != 1) {
        generate_exception("Expected for statement");
    }
    reader.get_token();

    // Read the iterator name
    if (reader.check_type(Type::VARIABLE) != 1) {
        generate_exception("Expected iterator name ( as variable, for example $i )");
    }
    auto iterator_name_token {reader.get_token()};
    std::string iterator_name {dynamic_cast<ninx::lexer::token::Variable*>(iterator_name_token)->get_name()};

    // Expect : separator
    if (reader.check_limiter(':') != 1) {
        generate_exception("Expected :");
    }
    reader.get_token();

    // Parse the expression
    auto expression {parse_expression()};

    // Parse the for body
    auto body {parse_block()};

    auto for_condition = std::make_unique<ForStatement>(iterator_name, std::move(expression), std::move(body));

    return for_condition;
}